

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.h
# Opt level: O2

bool google::protobuf::compiler::java::CheckUtf8(FieldDescriptor *descriptor)

{
  undefined1 uVar1;
  ConstType pJVar2;
  
  pJVar2 = FeatureSet::
           GetExtension<google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false,_0>
                     (descriptor->merged_features_,
                      (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::JavaFeatures>,_(unsigned_char)__v_,_false>
                       *)pb::java);
  uVar1 = 1;
  if (((pJVar2->field_0)._impl_.utf8_validation_ != 2) &&
     ((descriptor->merged_features_->field_0)._impl_.utf8_validation_ != 2)) {
    uVar1 = (descriptor->file_->options_->field_0)._impl_.java_string_check_utf8_;
  }
  return (bool)uVar1;
}

Assistant:

inline bool CheckUtf8(const FieldDescriptor* descriptor) {
  if (JavaGenerator::GetResolvedSourceFeatures(*descriptor)
          .GetExtension(pb::java)
          .utf8_validation() == pb::JavaFeatures::VERIFY) {
    return true;
  }
  return JavaGenerator::GetResolvedSourceFeatures(*descriptor)
                 .utf8_validation() == FeatureSet::VERIFY ||
         // For legacy syntax. This is not allowed under Editions.
         descriptor->file()->options().java_string_check_utf8();
}